

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O1

CImg<unsigned_int> * __thiscall
cimg_library::CImg<unsigned_int>::_get_permute_axes<unsigned_int>
          (CImg<unsigned_int> *__return_storage_ptr__,CImg<unsigned_int> *this,char *permut,
          uint *param_2)

{
  char cVar1;
  uint uVar2;
  long lVar3;
  CImgArgumentException *this_00;
  uint *puVar4;
  long lVar5;
  char cVar6;
  long lVar7;
  uint *puVar8;
  char cVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  char *pcVar13;
  long lVar14;
  uint *puVar15;
  long lVar16;
  bool bVar17;
  CImg<unsigned_int> res;
  
  puVar15 = this->_data;
  bVar17 = true;
  if ((this->_depth != 0 && this->_height != 0) && (this->_width != 0 && puVar15 != (uint *)0x0)) {
    bVar17 = this->_spectrum == 0;
  }
  if ((permut == (char *)0x0) || (bVar17)) {
    CImg(__return_storage_ptr__,this,false);
    return __return_storage_ptr__;
  }
  res._data = (uint *)0x0;
  res._width = 0;
  res._height = 0;
  res._depth = 0;
  res._spectrum = 0;
  res._is_shared = false;
  lVar3 = 0;
  do {
    cVar1 = permut[lVar3];
    cVar6 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar6 = cVar1;
    }
    cVar1 = "xyzc"[lVar3];
    cVar9 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar9 = cVar1;
    }
    if (cVar6 != cVar9) goto LAB_00132727;
    lVar3 = lVar3 + 1;
  } while ((int)lVar3 != 4);
  lVar3 = 4;
LAB_00132727:
  if (cVar6 == cVar9 || (int)lVar3 == 4) {
    CImg(__return_storage_ptr__,this,false);
  }
  else {
    lVar3 = 0;
    do {
      cVar1 = permut[lVar3];
      cVar6 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar6 = cVar1;
      }
      cVar1 = "xycz"[lVar3];
      cVar9 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar9 = cVar1;
      }
      if (cVar6 != cVar9) goto LAB_001327b2;
      lVar3 = lVar3 + 1;
    } while ((int)lVar3 != 4);
    lVar3 = 4;
LAB_001327b2:
    if ((cVar6 == cVar9 || (int)lVar3 == 4) &&
       (assign(&res,this->_width,this->_height,this->_spectrum,this->_depth),
       0 < (int)this->_spectrum)) {
      lVar3 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      lVar5 = 0;
      do {
        if (0 < (int)this->_depth) {
          lVar7 = 0;
          do {
            if (0 < (int)this->_height) {
              iVar10 = 0;
              do {
                if (0 < (int)this->_width) {
                  iVar11 = 0;
                  do {
                    uVar2 = *puVar15;
                    puVar15 = puVar15 + 1;
                    res._data[lVar3 * lVar5 +
                              (res._8_8_ & 0xffffffff) * lVar3 * lVar7 +
                              (ulong)(res._width * iVar10 + iVar11)] = uVar2;
                    iVar11 = iVar11 + 1;
                  } while (iVar11 < (int)this->_width);
                }
                iVar10 = iVar10 + 1;
              } while (iVar10 < (int)this->_height);
            }
            lVar7 = lVar7 + 1;
          } while (lVar7 < (int)this->_depth);
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < (int)this->_spectrum);
    }
    lVar3 = 0;
    do {
      cVar1 = permut[lVar3];
      cVar6 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar6 = cVar1;
      }
      cVar1 = "xzyc"[lVar3];
      cVar9 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar9 = cVar1;
      }
      if (cVar6 != cVar9) goto LAB_001328b2;
      lVar3 = lVar3 + 1;
    } while ((int)lVar3 != 4);
    lVar3 = 4;
LAB_001328b2:
    if ((cVar6 == cVar9 || (int)lVar3 == 4) &&
       (assign(&res,this->_width,this->_depth,this->_height,this->_spectrum),
       0 < (int)this->_spectrum)) {
      lVar3 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      lVar5 = 0;
      do {
        if (0 < (int)this->_depth) {
          iVar10 = 0;
          do {
            if (0 < (int)this->_height) {
              lVar7 = 0;
              do {
                if (0 < (int)this->_width) {
                  iVar11 = 0;
                  do {
                    uVar2 = *puVar15;
                    puVar15 = puVar15 + 1;
                    res._data[(res._8_8_ & 0xffffffff) * lVar3 * lVar5 +
                              lVar3 * lVar7 + (ulong)(res._width * iVar10 + iVar11)] = uVar2;
                    iVar11 = iVar11 + 1;
                  } while (iVar11 < (int)this->_width);
                }
                lVar7 = lVar7 + 1;
              } while (lVar7 < (int)this->_height);
            }
            iVar10 = iVar10 + 1;
          } while (iVar10 < (int)this->_depth);
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < (int)this->_spectrum);
    }
    lVar3 = 0;
    do {
      cVar1 = permut[lVar3];
      cVar6 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar6 = cVar1;
      }
      cVar1 = "xzcy"[lVar3];
      cVar9 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar9 = cVar1;
      }
      if (cVar6 != cVar9) goto LAB_001329bc;
      lVar3 = lVar3 + 1;
    } while ((int)lVar3 != 4);
    lVar3 = 4;
LAB_001329bc:
    if ((cVar6 == cVar9 || (int)lVar3 == 4) &&
       (assign(&res,this->_width,this->_depth,this->_spectrum,this->_height),
       0 < (int)this->_spectrum)) {
      lVar3 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      lVar5 = 0;
      do {
        if (0 < (int)this->_depth) {
          iVar10 = 0;
          do {
            if (0 < (int)this->_height) {
              lVar7 = 0;
              do {
                if (0 < (int)this->_width) {
                  iVar11 = 0;
                  do {
                    uVar2 = *puVar15;
                    puVar15 = puVar15 + 1;
                    res._data[lVar3 * lVar5 +
                              (res._8_8_ & 0xffffffff) * lVar3 * lVar7 +
                              (ulong)(res._width * iVar10 + iVar11)] = uVar2;
                    iVar11 = iVar11 + 1;
                  } while (iVar11 < (int)this->_width);
                }
                lVar7 = lVar7 + 1;
              } while (lVar7 < (int)this->_height);
            }
            iVar10 = iVar10 + 1;
          } while (iVar10 < (int)this->_depth);
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < (int)this->_spectrum);
    }
    lVar3 = 0;
    do {
      cVar1 = permut[lVar3];
      cVar6 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar6 = cVar1;
      }
      cVar1 = "xcyz"[lVar3];
      cVar9 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar9 = cVar1;
      }
      if (cVar6 != cVar9) goto LAB_00132ac6;
      lVar3 = lVar3 + 1;
    } while ((int)lVar3 != 4);
    lVar3 = 4;
LAB_00132ac6:
    if ((cVar6 == cVar9 || (int)lVar3 == 4) &&
       (assign(&res,this->_width,this->_spectrum,this->_height,this->_depth),
       0 < (int)this->_spectrum)) {
      lVar3 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      iVar10 = 0;
      do {
        if (0 < (int)this->_depth) {
          lVar5 = 0;
          do {
            if (0 < (int)this->_height) {
              lVar7 = 0;
              do {
                if (0 < (int)this->_width) {
                  iVar11 = 0;
                  do {
                    uVar2 = *puVar15;
                    puVar15 = puVar15 + 1;
                    res._data[(res._8_8_ & 0xffffffff) * lVar3 * lVar5 +
                              lVar3 * lVar7 + (ulong)(res._width * iVar10 + iVar11)] = uVar2;
                    iVar11 = iVar11 + 1;
                  } while (iVar11 < (int)this->_width);
                }
                lVar7 = lVar7 + 1;
              } while (lVar7 < (int)this->_height);
            }
            lVar5 = lVar5 + 1;
          } while (lVar5 < (int)this->_depth);
        }
        iVar10 = iVar10 + 1;
      } while (iVar10 < (int)this->_spectrum);
    }
    lVar3 = 0;
    do {
      cVar1 = permut[lVar3];
      cVar6 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar6 = cVar1;
      }
      cVar1 = "xczy"[lVar3];
      cVar9 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar9 = cVar1;
      }
      if (cVar6 != cVar9) goto LAB_00132bcd;
      lVar3 = lVar3 + 1;
    } while ((int)lVar3 != 4);
    lVar3 = 4;
LAB_00132bcd:
    if ((cVar6 == cVar9 || (int)lVar3 == 4) &&
       (assign(&res,this->_width,this->_spectrum,this->_depth,this->_height),
       0 < (int)this->_spectrum)) {
      lVar3 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      iVar10 = 0;
      do {
        if (0 < (int)this->_depth) {
          lVar5 = 0;
          do {
            if (0 < (int)this->_height) {
              lVar7 = 0;
              do {
                if (0 < (int)this->_width) {
                  iVar11 = 0;
                  do {
                    uVar2 = *puVar15;
                    puVar15 = puVar15 + 1;
                    res._data[lVar3 * lVar5 +
                              (res._8_8_ & 0xffffffff) * lVar3 * lVar7 +
                              (ulong)(res._width * iVar10 + iVar11)] = uVar2;
                    iVar11 = iVar11 + 1;
                  } while (iVar11 < (int)this->_width);
                }
                lVar7 = lVar7 + 1;
              } while (lVar7 < (int)this->_height);
            }
            lVar5 = lVar5 + 1;
          } while (lVar5 < (int)this->_depth);
        }
        iVar10 = iVar10 + 1;
      } while (iVar10 < (int)this->_spectrum);
    }
    lVar3 = 0;
    do {
      cVar1 = permut[lVar3];
      cVar6 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar6 = cVar1;
      }
      cVar1 = "yxzc"[lVar3];
      cVar9 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar9 = cVar1;
      }
      if (cVar6 != cVar9) goto LAB_00132cd4;
      lVar3 = lVar3 + 1;
    } while ((int)lVar3 != 4);
    lVar3 = 4;
LAB_00132cd4:
    if ((cVar6 == cVar9 || (int)lVar3 == 4) &&
       (assign(&res,this->_height,this->_width,this->_depth,this->_spectrum),
       0 < (int)this->_spectrum)) {
      lVar3 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      lVar5 = 0;
      do {
        if (0 < (int)this->_depth) {
          lVar7 = 0;
          do {
            if (0 < (int)this->_height) {
              iVar10 = 0;
              do {
                if (0 < (int)this->_width) {
                  iVar11 = 0;
                  do {
                    uVar2 = *puVar15;
                    puVar15 = puVar15 + 1;
                    res._data[lVar3 * lVar7 +
                              (res._8_8_ & 0xffffffff) * lVar3 * lVar5 +
                              (ulong)(res._width * iVar11 + iVar10)] = uVar2;
                    iVar11 = iVar11 + 1;
                  } while (iVar11 < (int)this->_width);
                }
                iVar10 = iVar10 + 1;
              } while (iVar10 < (int)this->_height);
            }
            lVar7 = lVar7 + 1;
          } while (lVar7 < (int)this->_depth);
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < (int)this->_spectrum);
    }
    lVar3 = 0;
    do {
      cVar1 = permut[lVar3];
      cVar6 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar6 = cVar1;
      }
      cVar1 = "yxcz"[lVar3];
      cVar9 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar9 = cVar1;
      }
      if (cVar6 != cVar9) goto LAB_00132ddc;
      lVar3 = lVar3 + 1;
    } while ((int)lVar3 != 4);
    lVar3 = 4;
LAB_00132ddc:
    if ((cVar6 == cVar9 || (int)lVar3 == 4) &&
       (assign(&res,this->_height,this->_width,this->_spectrum,this->_depth),
       0 < (int)this->_spectrum)) {
      lVar3 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      lVar5 = 0;
      do {
        if (0 < (int)this->_depth) {
          lVar7 = 0;
          do {
            if (0 < (int)this->_height) {
              iVar10 = 0;
              do {
                if (0 < (int)this->_width) {
                  iVar11 = 0;
                  do {
                    uVar2 = *puVar15;
                    puVar15 = puVar15 + 1;
                    res._data[lVar3 * lVar5 +
                              (res._8_8_ & 0xffffffff) * lVar3 * lVar7 +
                              (ulong)(res._width * iVar11 + iVar10)] = uVar2;
                    iVar11 = iVar11 + 1;
                  } while (iVar11 < (int)this->_width);
                }
                iVar10 = iVar10 + 1;
              } while (iVar10 < (int)this->_height);
            }
            lVar7 = lVar7 + 1;
          } while (lVar7 < (int)this->_depth);
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < (int)this->_spectrum);
    }
    lVar3 = 0;
    do {
      cVar1 = permut[lVar3];
      cVar6 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar6 = cVar1;
      }
      cVar1 = "yzxc"[lVar3];
      cVar9 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar9 = cVar1;
      }
      if (cVar6 != cVar9) goto LAB_00132ee7;
      lVar3 = lVar3 + 1;
    } while ((int)lVar3 != 4);
    lVar3 = 4;
LAB_00132ee7:
    if ((cVar6 == cVar9 || (int)lVar3 == 4) &&
       (assign(&res,this->_height,this->_depth,this->_width,this->_spectrum),
       0 < (int)this->_spectrum)) {
      lVar3 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      lVar5 = 0;
      lVar7 = 0;
      do {
        if (0 < (int)this->_depth) {
          iVar10 = 0;
          do {
            if (0 < (int)this->_height) {
              iVar11 = 0;
              do {
                if (0 < (int)this->_width) {
                  lVar12 = 0;
                  lVar16 = 0;
                  lVar14 = (long)res._data + lVar5;
                  do {
                    *(uint *)(lVar14 + (ulong)(res._width * iVar10 + iVar11) * 4) = puVar15[lVar16];
                    lVar16 = lVar16 + 1;
                    lVar14 = lVar14 + lVar3 * 4;
                    lVar12 = lVar12 + 4;
                  } while (lVar16 < (int)this->_width);
                  puVar15 = (uint *)((long)puVar15 + lVar12);
                }
                iVar11 = iVar11 + 1;
              } while (iVar11 < (int)this->_height);
            }
            iVar10 = iVar10 + 1;
          } while (iVar10 < (int)this->_depth);
        }
        lVar7 = lVar7 + 1;
        lVar5 = lVar5 + (res._8_8_ & 0xffffffff) * lVar3 * 4;
      } while (lVar7 < (int)this->_spectrum);
    }
    lVar3 = 0;
    do {
      cVar1 = permut[lVar3];
      cVar6 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar6 = cVar1;
      }
      cVar1 = "yzcx"[lVar3];
      cVar9 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar9 = cVar1;
      }
      if (cVar6 != cVar9) goto LAB_00132ff2;
      lVar3 = lVar3 + 1;
    } while ((int)lVar3 != 4);
    lVar3 = 4;
LAB_00132ff2:
    if (cVar6 == cVar9 || (int)lVar3 == 4) {
      assign(&res,this->_height,this->_depth,this->_spectrum,this->_width);
      switch(this->_width) {
      case 1:
        iVar10 = this->_depth * this->_height * this->_spectrum;
        if (iVar10 != 0) {
          lVar3 = 0;
          do {
            uVar2 = *puVar15;
            puVar15 = puVar15 + 1;
            res._data[lVar3] = uVar2;
            lVar3 = lVar3 + 1;
          } while (iVar10 != (int)lVar3);
        }
        break;
      case 2:
        iVar10 = this->_depth * this->_height * this->_spectrum;
        if (iVar10 != 0) {
          lVar3 = 0;
          do {
            res._data[lVar3] = *puVar15;
            puVar8 = puVar15 + 1;
            puVar15 = puVar15 + 2;
            res._data[(res._8_8_ & 0xffffffff) * (res._0_8_ & 0xffffffff) * (ulong)res._height +
                      lVar3] = *puVar8;
            lVar3 = lVar3 + 1;
          } while (iVar10 != (int)lVar3);
        }
        break;
      case 3:
        iVar10 = this->_depth * this->_height * this->_spectrum;
        if (iVar10 != 0) {
          lVar3 = (res._8_8_ & 0xffffffff) * (res._0_8_ & 0xffffffff) * (ulong)res._height;
          lVar5 = 0;
          do {
            res._data[lVar5] = *puVar15;
            res._data[lVar3 + lVar5] = puVar15[1];
            puVar8 = puVar15 + 2;
            puVar15 = puVar15 + 3;
            res._data[lVar3 * 2 + lVar5] = *puVar8;
            lVar5 = lVar5 + 1;
          } while (iVar10 != (int)lVar5);
        }
        break;
      case 4:
        iVar10 = this->_depth * this->_height * this->_spectrum;
        if (iVar10 != 0) {
          lVar3 = (res._8_8_ & 0xffffffff) * (res._0_8_ & 0xffffffff) * (ulong)res._height;
          lVar5 = 0;
          do {
            res._data[lVar5] = *puVar15;
            res._data[lVar3 + lVar5] = puVar15[1];
            res._data[lVar3 * 2 + lVar5] = puVar15[2];
            puVar8 = puVar15 + 3;
            puVar15 = puVar15 + 4;
            res._data[lVar3 * 3 + lVar5] = *puVar8;
            lVar5 = lVar5 + 1;
          } while (iVar10 != (int)lVar5);
        }
        break;
      default:
        if (0 < (int)this->_spectrum) {
          lVar3 = (ulong)res._height * (res._0_8_ & 0xffffffff);
          lVar5 = 0;
          lVar7 = 0;
          do {
            if (0 < (int)this->_depth) {
              iVar10 = 0;
              do {
                if (0 < (int)this->_height) {
                  iVar11 = 0;
                  do {
                    if (0 < (int)this->_width) {
                      lVar12 = 0;
                      lVar16 = 0;
                      lVar14 = (long)res._data + lVar5;
                      do {
                        *(uint *)(lVar14 + (ulong)(res._width * iVar10 + iVar11) * 4) =
                             puVar15[lVar16];
                        lVar16 = lVar16 + 1;
                        lVar14 = lVar14 + (res._8_8_ & 0xffffffff) * lVar3 * 4;
                        lVar12 = lVar12 + 4;
                      } while (lVar16 < (int)this->_width);
                      puVar15 = (uint *)((long)puVar15 + lVar12);
                    }
                    iVar11 = iVar11 + 1;
                  } while (iVar11 < (int)this->_height);
                }
                iVar10 = iVar10 + 1;
              } while (iVar10 < (int)this->_depth);
            }
            lVar7 = lVar7 + 1;
            lVar5 = lVar5 + lVar3 * 4;
          } while (lVar7 < (int)this->_spectrum);
        }
        CImg(__return_storage_ptr__,&res);
        goto LAB_0013424e;
      }
    }
    lVar3 = 0;
    do {
      cVar1 = permut[lVar3];
      cVar6 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar6 = cVar1;
      }
      cVar1 = "ycxz"[lVar3];
      cVar9 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar9 = cVar1;
      }
      if (cVar6 != cVar9) goto LAB_001331db;
      lVar3 = lVar3 + 1;
    } while ((int)lVar3 != 4);
    lVar3 = 4;
LAB_001331db:
    if ((cVar6 == cVar9 || (int)lVar3 == 4) &&
       (assign(&res,this->_height,this->_spectrum,this->_width,this->_depth),
       0 < (int)this->_spectrum)) {
      lVar3 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      iVar10 = 0;
      do {
        if (0 < (int)this->_depth) {
          lVar5 = 0;
          lVar7 = 0;
          do {
            if (0 < (int)this->_height) {
              iVar11 = 0;
              do {
                if (0 < (int)this->_width) {
                  lVar12 = 0;
                  lVar16 = 0;
                  lVar14 = (long)res._data + lVar5;
                  do {
                    *(uint *)(lVar14 + (ulong)(res._width * iVar10 + iVar11) * 4) = puVar15[lVar16];
                    lVar16 = lVar16 + 1;
                    lVar14 = lVar14 + lVar3 * 4;
                    lVar12 = lVar12 + 4;
                  } while (lVar16 < (int)this->_width);
                  puVar15 = (uint *)((long)puVar15 + lVar12);
                }
                iVar11 = iVar11 + 1;
              } while (iVar11 < (int)this->_height);
            }
            lVar7 = lVar7 + 1;
            lVar5 = lVar5 + (res._8_8_ & 0xffffffff) * lVar3 * 4;
          } while (lVar7 < (int)this->_depth);
        }
        iVar10 = iVar10 + 1;
      } while (iVar10 < (int)this->_spectrum);
    }
    lVar3 = 0;
    do {
      cVar1 = permut[lVar3];
      cVar6 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar6 = cVar1;
      }
      cVar1 = "yczx"[lVar3];
      cVar9 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar9 = cVar1;
      }
      if (cVar6 != cVar9) goto LAB_001332e6;
      lVar3 = lVar3 + 1;
    } while ((int)lVar3 != 4);
    lVar3 = 4;
LAB_001332e6:
    if ((cVar6 == cVar9 || (int)lVar3 == 4) &&
       (assign(&res,this->_height,this->_spectrum,this->_depth,this->_width),
       0 < (int)this->_spectrum)) {
      lVar3 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      iVar10 = 0;
      do {
        if (0 < (int)this->_depth) {
          lVar5 = 0;
          lVar7 = 0;
          do {
            if (0 < (int)this->_height) {
              iVar11 = 0;
              do {
                if (0 < (int)this->_width) {
                  lVar12 = 0;
                  lVar16 = 0;
                  lVar14 = (long)res._data + lVar5;
                  do {
                    *(uint *)(lVar14 + (ulong)(res._width * iVar10 + iVar11) * 4) = puVar15[lVar16];
                    lVar16 = lVar16 + 1;
                    lVar14 = lVar14 + (res._8_8_ & 0xffffffff) * lVar3 * 4;
                    lVar12 = lVar12 + 4;
                  } while (lVar16 < (int)this->_width);
                  puVar15 = (uint *)((long)puVar15 + lVar12);
                }
                iVar11 = iVar11 + 1;
              } while (iVar11 < (int)this->_height);
            }
            lVar7 = lVar7 + 1;
            lVar5 = lVar5 + lVar3 * 4;
          } while (lVar7 < (int)this->_depth);
        }
        iVar10 = iVar10 + 1;
      } while (iVar10 < (int)this->_spectrum);
    }
    lVar3 = 0;
    do {
      cVar1 = permut[lVar3];
      cVar6 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar6 = cVar1;
      }
      cVar1 = "zxyc"[lVar3];
      cVar9 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar9 = cVar1;
      }
      if (cVar6 != cVar9) goto LAB_001333f5;
      lVar3 = lVar3 + 1;
    } while ((int)lVar3 != 4);
    lVar3 = 4;
LAB_001333f5:
    if ((cVar6 == cVar9 || (int)lVar3 == 4) &&
       (assign(&res,this->_depth,this->_width,this->_height,this->_spectrum),
       0 < (int)this->_spectrum)) {
      lVar3 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      lVar5 = 0;
      do {
        if (0 < (int)this->_depth) {
          iVar10 = 0;
          do {
            if (0 < (int)this->_height) {
              lVar7 = 0;
              do {
                if (0 < (int)this->_width) {
                  iVar11 = 0;
                  do {
                    uVar2 = *puVar15;
                    puVar15 = puVar15 + 1;
                    res._data[(res._8_8_ & 0xffffffff) * lVar3 * lVar5 +
                              lVar3 * lVar7 + (ulong)(res._width * iVar11 + iVar10)] = uVar2;
                    iVar11 = iVar11 + 1;
                  } while (iVar11 < (int)this->_width);
                }
                lVar7 = lVar7 + 1;
              } while (lVar7 < (int)this->_height);
            }
            iVar10 = iVar10 + 1;
          } while (iVar10 < (int)this->_depth);
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < (int)this->_spectrum);
    }
    lVar3 = 0;
    do {
      cVar1 = permut[lVar3];
      cVar6 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar6 = cVar1;
      }
      cVar1 = "zxcy"[lVar3];
      cVar9 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar9 = cVar1;
      }
      if (cVar6 != cVar9) goto LAB_001334ff;
      lVar3 = lVar3 + 1;
    } while ((int)lVar3 != 4);
    lVar3 = 4;
LAB_001334ff:
    if ((cVar6 == cVar9 || (int)lVar3 == 4) &&
       (assign(&res,this->_depth,this->_width,this->_spectrum,this->_height),
       0 < (int)this->_spectrum)) {
      lVar3 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      lVar5 = 0;
      do {
        if (0 < (int)this->_depth) {
          iVar10 = 0;
          do {
            if (0 < (int)this->_height) {
              lVar7 = 0;
              do {
                if (0 < (int)this->_width) {
                  iVar11 = 0;
                  do {
                    uVar2 = *puVar15;
                    puVar15 = puVar15 + 1;
                    res._data[lVar3 * lVar5 +
                              (res._8_8_ & 0xffffffff) * lVar3 * lVar7 +
                              (ulong)(res._width * iVar11 + iVar10)] = uVar2;
                    iVar11 = iVar11 + 1;
                  } while (iVar11 < (int)this->_width);
                }
                lVar7 = lVar7 + 1;
              } while (lVar7 < (int)this->_height);
            }
            iVar10 = iVar10 + 1;
          } while (iVar10 < (int)this->_depth);
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < (int)this->_spectrum);
    }
    lVar3 = 0;
    do {
      cVar1 = permut[lVar3];
      cVar6 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar6 = cVar1;
      }
      cVar1 = "zyxc"[lVar3];
      cVar9 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar9 = cVar1;
      }
      if (cVar6 != cVar9) goto LAB_00133609;
      lVar3 = lVar3 + 1;
    } while ((int)lVar3 != 4);
    lVar3 = 4;
LAB_00133609:
    if ((cVar6 == cVar9 || (int)lVar3 == 4) &&
       (assign(&res,this->_depth,this->_height,this->_width,this->_spectrum),
       0 < (int)this->_spectrum)) {
      lVar3 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      lVar5 = 0;
      lVar7 = 0;
      do {
        if (0 < (int)this->_depth) {
          iVar10 = 0;
          do {
            if (0 < (int)this->_height) {
              iVar11 = 0;
              do {
                if (0 < (int)this->_width) {
                  lVar12 = 0;
                  lVar16 = 0;
                  lVar14 = (long)res._data + lVar5;
                  do {
                    *(uint *)(lVar14 + (ulong)(res._width * iVar11 + iVar10) * 4) = puVar15[lVar16];
                    lVar16 = lVar16 + 1;
                    lVar14 = lVar14 + lVar3 * 4;
                    lVar12 = lVar12 + 4;
                  } while (lVar16 < (int)this->_width);
                  puVar15 = (uint *)((long)puVar15 + lVar12);
                }
                iVar11 = iVar11 + 1;
              } while (iVar11 < (int)this->_height);
            }
            iVar10 = iVar10 + 1;
          } while (iVar10 < (int)this->_depth);
        }
        lVar7 = lVar7 + 1;
        lVar5 = lVar5 + (res._8_8_ & 0xffffffff) * lVar3 * 4;
      } while (lVar7 < (int)this->_spectrum);
    }
    lVar3 = 0;
    do {
      cVar1 = permut[lVar3];
      cVar6 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar6 = cVar1;
      }
      cVar1 = "zycx"[lVar3];
      cVar9 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar9 = cVar1;
      }
      if (cVar6 != cVar9) goto LAB_00133714;
      lVar3 = lVar3 + 1;
    } while ((int)lVar3 != 4);
    lVar3 = 4;
LAB_00133714:
    if ((cVar6 == cVar9 || (int)lVar3 == 4) &&
       (assign(&res,this->_depth,this->_height,this->_spectrum,this->_width),
       0 < (int)this->_spectrum)) {
      lVar3 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      lVar5 = 0;
      lVar7 = 0;
      do {
        if (0 < (int)this->_depth) {
          iVar10 = 0;
          do {
            if (0 < (int)this->_height) {
              iVar11 = 0;
              do {
                if (0 < (int)this->_width) {
                  lVar12 = 0;
                  lVar16 = 0;
                  lVar14 = (long)res._data + lVar5;
                  do {
                    *(uint *)(lVar14 + (ulong)(res._width * iVar11 + iVar10) * 4) = puVar15[lVar16];
                    lVar16 = lVar16 + 1;
                    lVar14 = lVar14 + (res._8_8_ & 0xffffffff) * lVar3 * 4;
                    lVar12 = lVar12 + 4;
                  } while (lVar16 < (int)this->_width);
                  puVar15 = (uint *)((long)puVar15 + lVar12);
                }
                iVar11 = iVar11 + 1;
              } while (iVar11 < (int)this->_height);
            }
            iVar10 = iVar10 + 1;
          } while (iVar10 < (int)this->_depth);
        }
        lVar7 = lVar7 + 1;
        lVar5 = lVar5 + lVar3 * 4;
      } while (lVar7 < (int)this->_spectrum);
    }
    lVar3 = 0;
    do {
      cVar1 = permut[lVar3];
      cVar6 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar6 = cVar1;
      }
      cVar1 = "zcxy"[lVar3];
      cVar9 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar9 = cVar1;
      }
      if (cVar6 != cVar9) goto LAB_00133823;
      lVar3 = lVar3 + 1;
    } while ((int)lVar3 != 4);
    lVar3 = 4;
LAB_00133823:
    if ((cVar6 == cVar9 || (int)lVar3 == 4) &&
       (assign(&res,this->_depth,this->_spectrum,this->_width,this->_height),
       0 < (int)this->_spectrum)) {
      lVar3 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      iVar10 = 0;
      do {
        if (0 < (int)this->_depth) {
          iVar11 = 0;
          do {
            if (0 < (int)this->_height) {
              lVar5 = 0;
              puVar8 = res._data;
              do {
                if (0 < (int)this->_width) {
                  lVar7 = 0;
                  lVar14 = 0;
                  puVar4 = puVar8;
                  do {
                    puVar4[res._width * iVar10 + iVar11] = puVar15[lVar14];
                    lVar14 = lVar14 + 1;
                    puVar4 = puVar4 + lVar3;
                    lVar7 = lVar7 + 4;
                  } while (lVar14 < (int)this->_width);
                  puVar15 = (uint *)((long)puVar15 + lVar7);
                }
                lVar5 = lVar5 + 1;
                puVar8 = puVar8 + (res._8_8_ & 0xffffffff) * lVar3;
              } while (lVar5 < (int)this->_height);
            }
            iVar11 = iVar11 + 1;
          } while (iVar11 < (int)this->_depth);
        }
        iVar10 = iVar10 + 1;
      } while (iVar10 < (int)this->_spectrum);
    }
    lVar3 = 0;
    do {
      cVar1 = permut[lVar3];
      cVar6 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar6 = cVar1;
      }
      cVar1 = "zcyx"[lVar3];
      cVar9 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar9 = cVar1;
      }
      if (cVar6 != cVar9) goto LAB_0013392a;
      lVar3 = lVar3 + 1;
    } while ((int)lVar3 != 4);
    lVar3 = 4;
LAB_0013392a:
    if ((cVar6 == cVar9 || (int)lVar3 == 4) &&
       (assign(&res,this->_depth,this->_spectrum,this->_height,this->_width),
       0 < (int)this->_spectrum)) {
      lVar3 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      iVar10 = 0;
      do {
        if (0 < (int)this->_depth) {
          iVar11 = 0;
          do {
            if (0 < (int)this->_height) {
              lVar5 = 0;
              puVar8 = res._data;
              do {
                if (0 < (int)this->_width) {
                  lVar7 = 0;
                  lVar14 = 0;
                  puVar4 = puVar8;
                  do {
                    puVar4[res._width * iVar10 + iVar11] = puVar15[lVar14];
                    lVar14 = lVar14 + 1;
                    puVar4 = puVar4 + (res._8_8_ & 0xffffffff) * lVar3;
                    lVar7 = lVar7 + 4;
                  } while (lVar14 < (int)this->_width);
                  puVar15 = (uint *)((long)puVar15 + lVar7);
                }
                lVar5 = lVar5 + 1;
                puVar8 = puVar8 + lVar3;
              } while (lVar5 < (int)this->_height);
            }
            iVar11 = iVar11 + 1;
          } while (iVar11 < (int)this->_depth);
        }
        iVar10 = iVar10 + 1;
      } while (iVar10 < (int)this->_spectrum);
    }
    lVar3 = 0;
    do {
      cVar1 = permut[lVar3];
      cVar6 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar6 = cVar1;
      }
      cVar1 = "cxyz"[lVar3];
      cVar9 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar9 = cVar1;
      }
      if (cVar6 != cVar9) goto LAB_00133a35;
      lVar3 = lVar3 + 1;
    } while ((int)lVar3 != 4);
    lVar3 = 4;
LAB_00133a35:
    if (cVar6 == cVar9 || (int)lVar3 == 4) {
      assign(&res,this->_spectrum,this->_width,this->_height,this->_depth);
      switch(this->_spectrum) {
      case 1:
        lVar3 = (ulong)this->_depth * (ulong)this->_height * (ulong)this->_width;
        if (lVar3 != 0) {
          puVar8 = this->_data;
          lVar5 = 0;
          do {
            res._data[lVar5] = puVar8[lVar5];
            lVar5 = lVar5 + 1;
          } while (lVar3 - lVar5 != 0);
        }
        break;
      case 2:
        lVar3 = (ulong)this->_depth * (ulong)this->_height * (ulong)this->_width;
        if (lVar3 != 0) {
          puVar8 = this->_data;
          lVar5 = 0;
          do {
            res._data[lVar5 * 2] = puVar8[lVar5];
            res._data[lVar5 * 2 + 1] = puVar8[lVar3 + lVar5];
            lVar5 = lVar5 + 1;
          } while (lVar3 - lVar5 != 0);
        }
        break;
      case 3:
        lVar3 = (ulong)this->_depth * (ulong)this->_height * (ulong)this->_width;
        if (lVar3 != 0) {
          puVar8 = this->_data;
          lVar5 = 0;
          puVar4 = res._data;
          do {
            *puVar4 = puVar8[lVar5];
            puVar4[1] = puVar8[lVar3 + lVar5];
            puVar4[2] = puVar8[lVar3 * 2 + lVar5];
            puVar4 = puVar4 + 3;
            lVar5 = lVar5 + 1;
          } while (lVar3 - lVar5 != 0);
        }
        break;
      case 4:
        lVar3 = (ulong)this->_depth * (ulong)this->_height * (ulong)this->_width;
        if (lVar3 != 0) {
          puVar8 = this->_data;
          lVar5 = 0;
          puVar4 = res._data;
          do {
            *puVar4 = puVar8[lVar5];
            puVar4[1] = puVar8[lVar3 + lVar5];
            puVar4[2] = puVar8[lVar3 * 2 + lVar5];
            puVar4[3] = puVar8[lVar3 * 3 + lVar5];
            puVar4 = puVar4 + 4;
            lVar5 = lVar5 + 1;
          } while (lVar3 - lVar5 != 0);
        }
        break;
      default:
        if (0 < (int)this->_spectrum) {
          lVar3 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
          iVar10 = 0;
          do {
            if (0 < (int)this->_depth) {
              lVar5 = 0;
              do {
                if (0 < (int)this->_height) {
                  lVar7 = 0;
                  do {
                    if (0 < (int)this->_width) {
                      iVar11 = 0;
                      do {
                        uVar2 = *puVar15;
                        puVar15 = puVar15 + 1;
                        res._data[(res._8_8_ & 0xffffffff) * lVar3 * lVar5 +
                                  lVar3 * lVar7 + (ulong)(res._width * iVar11 + iVar10)] = uVar2;
                        iVar11 = iVar11 + 1;
                      } while (iVar11 < (int)this->_width);
                    }
                    lVar7 = lVar7 + 1;
                  } while (lVar7 < (int)this->_height);
                }
                lVar5 = lVar5 + 1;
              } while (lVar5 < (int)this->_depth);
            }
            iVar10 = iVar10 + 1;
          } while (iVar10 < (int)this->_spectrum);
        }
      }
    }
    lVar3 = 0;
    do {
      cVar1 = permut[lVar3];
      cVar6 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar6 = cVar1;
      }
      cVar1 = "cxzy"[lVar3];
      cVar9 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar9 = cVar1;
      }
      if (cVar6 != cVar9) goto LAB_00133d4e;
      lVar3 = lVar3 + 1;
    } while ((int)lVar3 != 4);
    lVar3 = 4;
LAB_00133d4e:
    if ((cVar6 == cVar9 || (int)lVar3 == 4) &&
       (assign(&res,this->_spectrum,this->_width,this->_depth,this->_height),
       0 < (int)this->_spectrum)) {
      lVar3 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      iVar10 = 0;
      do {
        if (0 < (int)this->_depth) {
          lVar5 = 0;
          do {
            if (0 < (int)this->_height) {
              lVar7 = 0;
              do {
                if (0 < (int)this->_width) {
                  iVar11 = 0;
                  do {
                    uVar2 = *puVar15;
                    puVar15 = puVar15 + 1;
                    res._data[lVar3 * lVar5 +
                              (res._8_8_ & 0xffffffff) * lVar3 * lVar7 +
                              (ulong)(res._width * iVar11 + iVar10)] = uVar2;
                    iVar11 = iVar11 + 1;
                  } while (iVar11 < (int)this->_width);
                }
                lVar7 = lVar7 + 1;
              } while (lVar7 < (int)this->_height);
            }
            lVar5 = lVar5 + 1;
          } while (lVar5 < (int)this->_depth);
        }
        iVar10 = iVar10 + 1;
      } while (iVar10 < (int)this->_spectrum);
    }
    lVar3 = 0;
    do {
      cVar1 = permut[lVar3];
      cVar6 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar6 = cVar1;
      }
      cVar1 = "cyxz"[lVar3];
      cVar9 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar9 = cVar1;
      }
      if (cVar6 != cVar9) goto LAB_00133e53;
      lVar3 = lVar3 + 1;
    } while ((int)lVar3 != 4);
    lVar3 = 4;
LAB_00133e53:
    if ((cVar6 == cVar9 || (int)lVar3 == 4) &&
       (assign(&res,this->_spectrum,this->_height,this->_width,this->_depth),
       0 < (int)this->_spectrum)) {
      lVar3 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      iVar10 = 0;
      do {
        if (0 < (int)this->_depth) {
          lVar5 = 0;
          lVar7 = 0;
          do {
            if (0 < (int)this->_height) {
              iVar11 = 0;
              do {
                if (0 < (int)this->_width) {
                  lVar12 = 0;
                  lVar16 = 0;
                  lVar14 = (long)res._data + lVar5;
                  do {
                    *(uint *)(lVar14 + (ulong)(res._width * iVar11 + iVar10) * 4) = puVar15[lVar16];
                    lVar16 = lVar16 + 1;
                    lVar14 = lVar14 + lVar3 * 4;
                    lVar12 = lVar12 + 4;
                  } while (lVar16 < (int)this->_width);
                  puVar15 = (uint *)((long)puVar15 + lVar12);
                }
                iVar11 = iVar11 + 1;
              } while (iVar11 < (int)this->_height);
            }
            lVar7 = lVar7 + 1;
            lVar5 = lVar5 + (res._8_8_ & 0xffffffff) * lVar3 * 4;
          } while (lVar7 < (int)this->_depth);
        }
        iVar10 = iVar10 + 1;
      } while (iVar10 < (int)this->_spectrum);
    }
    lVar3 = 0;
    do {
      cVar1 = permut[lVar3];
      cVar6 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar6 = cVar1;
      }
      cVar1 = "cyzx"[lVar3];
      cVar9 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar9 = cVar1;
      }
      if (cVar6 != cVar9) goto LAB_00133f5e;
      lVar3 = lVar3 + 1;
    } while ((int)lVar3 != 4);
    lVar3 = 4;
LAB_00133f5e:
    if ((cVar6 == cVar9 || (int)lVar3 == 4) &&
       (assign(&res,this->_spectrum,this->_height,this->_depth,this->_width),
       0 < (int)this->_spectrum)) {
      lVar3 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      iVar10 = 0;
      do {
        if (0 < (int)this->_depth) {
          lVar5 = 0;
          lVar7 = 0;
          do {
            if (0 < (int)this->_height) {
              iVar11 = 0;
              do {
                if (0 < (int)this->_width) {
                  lVar12 = 0;
                  lVar16 = 0;
                  lVar14 = (long)res._data + lVar5;
                  do {
                    *(uint *)(lVar14 + (ulong)(res._width * iVar11 + iVar10) * 4) = puVar15[lVar16];
                    lVar16 = lVar16 + 1;
                    lVar14 = lVar14 + (res._8_8_ & 0xffffffff) * lVar3 * 4;
                    lVar12 = lVar12 + 4;
                  } while (lVar16 < (int)this->_width);
                  puVar15 = (uint *)((long)puVar15 + lVar12);
                }
                iVar11 = iVar11 + 1;
              } while (iVar11 < (int)this->_height);
            }
            lVar7 = lVar7 + 1;
            lVar5 = lVar5 + lVar3 * 4;
          } while (lVar7 < (int)this->_depth);
        }
        iVar10 = iVar10 + 1;
      } while (iVar10 < (int)this->_spectrum);
    }
    lVar3 = 0;
    do {
      cVar1 = permut[lVar3];
      cVar6 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar6 = cVar1;
      }
      cVar1 = "czxy"[lVar3];
      cVar9 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar9 = cVar1;
      }
      if (cVar6 != cVar9) goto LAB_0013406d;
      lVar3 = lVar3 + 1;
    } while ((int)lVar3 != 4);
    lVar3 = 4;
LAB_0013406d:
    if ((cVar6 == cVar9 || (int)lVar3 == 4) &&
       (assign(&res,this->_spectrum,this->_depth,this->_width,this->_height),
       0 < (int)this->_spectrum)) {
      lVar3 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      iVar10 = 0;
      do {
        if (0 < (int)this->_depth) {
          iVar11 = 0;
          do {
            if (0 < (int)this->_height) {
              lVar5 = 0;
              puVar8 = res._data;
              do {
                if (0 < (int)this->_width) {
                  lVar7 = 0;
                  lVar14 = 0;
                  puVar4 = puVar8;
                  do {
                    puVar4[res._width * iVar11 + iVar10] = puVar15[lVar14];
                    lVar14 = lVar14 + 1;
                    puVar4 = puVar4 + lVar3;
                    lVar7 = lVar7 + 4;
                  } while (lVar14 < (int)this->_width);
                  puVar15 = (uint *)((long)puVar15 + lVar7);
                }
                lVar5 = lVar5 + 1;
                puVar8 = puVar8 + (res._8_8_ & 0xffffffff) * lVar3;
              } while (lVar5 < (int)this->_height);
            }
            iVar11 = iVar11 + 1;
          } while (iVar11 < (int)this->_depth);
        }
        iVar10 = iVar10 + 1;
      } while (iVar10 < (int)this->_spectrum);
    }
    lVar3 = 0;
    do {
      cVar1 = permut[lVar3];
      cVar6 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar6 = cVar1;
      }
      cVar1 = "czyx"[lVar3];
      cVar9 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar9 = cVar1;
      }
      if (cVar6 != cVar9) goto LAB_00134174;
      lVar3 = lVar3 + 1;
    } while ((int)lVar3 != 4);
    lVar3 = 4;
LAB_00134174:
    if ((cVar6 == cVar9 || (int)lVar3 == 4) &&
       (assign(&res,this->_spectrum,this->_depth,this->_height,this->_width),
       0 < (int)this->_spectrum)) {
      lVar3 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      iVar10 = 0;
      do {
        if (0 < (int)this->_depth) {
          iVar11 = 0;
          do {
            if (0 < (int)this->_height) {
              lVar5 = 0;
              puVar8 = res._data;
              do {
                if (0 < (int)this->_width) {
                  lVar7 = 0;
                  lVar14 = 0;
                  puVar4 = puVar8;
                  do {
                    puVar4[res._width * iVar11 + iVar10] = puVar15[lVar14];
                    lVar14 = lVar14 + 1;
                    puVar4 = puVar4 + (res._8_8_ & 0xffffffff) * lVar3;
                    lVar7 = lVar7 + 4;
                  } while (lVar14 < (int)this->_width);
                  puVar15 = (uint *)((long)puVar15 + lVar7);
                }
                lVar5 = lVar5 + 1;
                puVar8 = puVar8 + lVar3;
              } while (lVar5 < (int)this->_height);
            }
            iVar11 = iVar11 + 1;
          } while (iVar11 < (int)this->_depth);
        }
        iVar10 = iVar10 + 1;
      } while (iVar10 < (int)this->_spectrum);
    }
    if (res._data == (uint *)0x0) {
      this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x4008);
      pcVar13 = "non-";
      if (this->_is_shared != false) {
        pcVar13 = "";
      }
      CImgArgumentException::CImgArgumentException
                (this_00,
                 "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::permute_axes(): Invalid specified permutation \'%s\'."
                 ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,
                 (ulong)this->_spectrum,this->_data,pcVar13,"unsigned int",permut);
      __cxa_throw(this_00,&CImgArgumentException::typeinfo,std::exception::~exception);
    }
    CImg(__return_storage_ptr__,&res);
  }
LAB_0013424e:
  if ((res._is_shared == false) && (res._data != (uint *)0x0)) {
    operator_delete__(res._data);
  }
  return __return_storage_ptr__;
}

Assistant:

CImg<t> _get_permute_axes(const char *const permut, const t&) const {
      if (is_empty() || !permut) return CImg<t>(*this,false);
      CImg<t> res;
      const T* ptrs = _data;
      if (!cimg::strncasecmp(permut,"xyzc",4)) return +*this;
      if (!cimg::strncasecmp(permut,"xycz",4)) {
	res.assign(_width,_height,_spectrum,_depth);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
	cimg_forXYZC(*this,x,y,z,c) res(x,y,c,z,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"xzyc",4)) {
	res.assign(_width,_depth,_height,_spectrum);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
	cimg_forXYZC(*this,x,y,z,c) res(x,z,y,c,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"xzcy",4)) {
	res.assign(_width,_depth,_spectrum,_height);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
	cimg_forXYZC(*this,x,y,z,c) res(x,z,c,y,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"xcyz",4)) {
	res.assign(_width,_spectrum,_height,_depth);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
	cimg_forXYZC(*this,x,y,z,c) res(x,c,y,z,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"xczy",4)) {
	res.assign(_width,_spectrum,_depth,_height);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
	cimg_forXYZC(*this,x,y,z,c) res(x,c,z,y,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"yxzc",4)) {
	res.assign(_height,_width,_depth,_spectrum);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
	cimg_forXYZC(*this,x,y,z,c) res(y,x,z,c,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"yxcz",4)) {
	res.assign(_height,_width,_spectrum,_depth);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
	cimg_forXYZC(*this,x,y,z,c) res(y,x,c,z,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"yzxc",4)) {
	res.assign(_height,_depth,_width,_spectrum);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
	cimg_forXYZC(*this,x,y,z,c) res(y,z,x,c,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"yzcx",4)) {
	res.assign(_height,_depth,_spectrum,_width);
	switch (_width) {
	case 1 : {
	  t *ptr_r = res.data(0,0,0,0);
	  for (unsigned int siz = _height*_depth*_spectrum; siz; --siz) {
	    *(ptr_r++) = (t)*(ptrs++);
	  }
	} break;
	case 2 : {
	  t *ptr_r = res.data(0,0,0,0), *ptr_g = res.data(0,0,0,1);
	  for (unsigned int siz = _height*_depth*_spectrum; siz; --siz) {
	    *(ptr_r++) = (t)*(ptrs++); *(ptr_g++) = (t)*(ptrs++);
	  }
	} break;
	case 3 : { // Optimization for the classical conversion from interleaved RGB to planar RGB
	  t *ptr_r = res.data(0,0,0,0), *ptr_g = res.data(0,0,0,1), *ptr_b = res.data(0,0,0,2);
	  for (unsigned int siz = _height*_depth*_spectrum; siz; --siz) {
	    *(ptr_r++) = (t)*(ptrs++); *(ptr_g++) = (t)*(ptrs++); *(ptr_b++) = (t)*(ptrs++);
	  }
	} break;
	case 4 : { // Optimization for the classical conversion from interleaved RGBA to planar RGBA
	  t *ptr_r = res.data(0,0,0,0), *ptr_g = res.data(0,0,0,1), *ptr_b = res.data(0,0,0,2), *ptr_a = res.data(0,0,0,3);
	  for (unsigned int siz = _height*_depth*_spectrum; siz; --siz) {
	    *(ptr_r++) = (t)*(ptrs++); *(ptr_g++) = (t)*(ptrs++); *(ptr_b++) = (t)*(ptrs++); *(ptr_a++) = (t)*(ptrs++);
	  }
	} break;
	default : {
          const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
	  cimg_forXYZC(*this,x,y,z,c) res(y,z,c,x,wh,whd) = *(ptrs++);
          return res;
	}
	}
      }
      if (!cimg::strncasecmp(permut,"ycxz",4)) {
	res.assign(_height,_spectrum,_width,_depth);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
	cimg_forXYZC(*this,x,y,z,c) res(y,c,x,z,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"yczx",4)) {
	res.assign(_height,_spectrum,_depth,_width);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
	cimg_forXYZC(*this,x,y,z,c) res(y,c,z,x,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"zxyc",4)) {
	res.assign(_depth,_width,_height,_spectrum);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
	cimg_forXYZC(*this,x,y,z,c) res(z,x,y,c,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"zxcy",4)) {
	res.assign(_depth,_width,_spectrum,_height);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
	cimg_forXYZC(*this,x,y,z,c) res(z,x,c,y,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"zyxc",4)) {
	res.assign(_depth,_height,_width,_spectrum);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
	cimg_forXYZC(*this,x,y,z,c) res(z,y,x,c,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"zycx",4)) {
	res.assign(_depth,_height,_spectrum,_width);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
	cimg_forXYZC(*this,x,y,z,c) res(z,y,c,x,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"zcxy",4)) {
	res.assign(_depth,_spectrum,_width,_height);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
	cimg_forXYZC(*this,x,y,z,c) res(z,c,x,y,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"zcyx",4)) {
	res.assign(_depth,_spectrum,_height,_width);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
	cimg_forXYZC(*this,x,y,z,c) res(z,c,y,x,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"cxyz",4)) {
	res.assign(_spectrum,_width,_height,_depth);
	switch (_spectrum) {
	case 1 : {
	  const T *ptr_r = data(0,0,0,0);
	  t *ptrd = res._data;
	  for (unsigned long siz = (unsigned long)_width*_height*_depth; siz; --siz) *(ptrd++) = (t)*(ptr_r++);
	} break;
	case 2 : {
	  const T *ptr_r = data(0,0,0,0), *ptr_g = data(0,0,0,1);
	  t *ptrd = res._data;
	  for (unsigned long siz = (unsigned long)_width*_height*_depth; siz; --siz) {
	    *(ptrd++) = (t)*(ptr_r++); *(ptrd++) = (t)*(ptr_g++);
	  }
	} break;
	case 3 : { // Optimization for the classical conversion from planar RGB to interleaved RGB
	  const T *ptr_r = data(0,0,0,0), *ptr_g = data(0,0,0,1), *ptr_b = data(0,0,0,2);
	  t *ptrd = res._data;
	  for (unsigned long siz = (unsigned long)_width*_height*_depth; siz; --siz) {
	    *(ptrd++) = (t)*(ptr_r++); *(ptrd++) = (t)*(ptr_g++); *(ptrd++) = (t)*(ptr_b++);
	  }
	} break;
	case 4 : { // Optimization for the classical conversion from planar RGBA to interleaved RGBA
	  const T *ptr_r = data(0,0,0,0), *ptr_g = data(0,0,0,1), *ptr_b = data(0,0,0,2), *ptr_a = data(0,0,0,3);
	  t *ptrd = res._data;
	  for (unsigned long siz = (unsigned long)_width*_height*_depth; siz; --siz) {
	    *(ptrd++) = (t)*(ptr_r++); *(ptrd++) = (t)*(ptr_g++); *(ptrd++) = (t)*(ptr_b++); *(ptrd++) = (t)*(ptr_a++);
	  }
	} break;
	default : {
          const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
	  cimg_forXYZC(*this,x,y,z,c) res(c,x,y,z,wh,whd) = (t)*(ptrs++);
	}
	}
      }
      if (!cimg::strncasecmp(permut,"cxzy",4)) {
	res.assign(_spectrum,_width,_depth,_height);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
	cimg_forXYZC(*this,x,y,z,c) res(c,x,z,y,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"cyxz",4)) {
	res.assign(_spectrum,_height,_width,_depth);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
	cimg_forXYZC(*this,x,y,z,c) res(c,y,x,z,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"cyzx",4)) {
	res.assign(_spectrum,_height,_depth,_width);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
	cimg_forXYZC(*this,x,y,z,c) res(c,y,z,x,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"czxy",4)) {
	res.assign(_spectrum,_depth,_width,_height);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
	cimg_forXYZC(*this,x,y,z,c) res(c,z,x,y,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"czyx",4)) {
	res.assign(_spectrum,_depth,_height,_width);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
	cimg_forXYZC(*this,x,y,z,c) res(c,z,y,x,wh,whd) = (t)*(ptrs++);
      }
      if (!res)
        throw CImgArgumentException(_cimg_instance
                                    "permute_axes(): Invalid specified permutation '%s'.",
                                    cimg_instance,
                                    permut);
      return res;
    }